

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O3

void __thiscall HinOut::readDataPostsolve(HinOut *this,HModel *ptr_model)

{
  int iVar1;
  int iVar2;
  
  iVar1 = ptr_model->numCol;
  (this->super_HPreData).numCol = iVar1;
  iVar2 = ptr_model->numRow;
  (this->super_HPreData).numRow = iVar2;
  (this->super_HPreData).numTot = iVar2 + iVar1;
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->super_HPreData).Astart,&ptr_model->Astart);
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->super_HPreData).Aindex,&ptr_model->Aindex);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->super_HPreData).Avalue,&ptr_model->Avalue);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->super_HPreData).colCost,&ptr_model->colCost);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->super_HPreData).colLower,&ptr_model->colLower);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->super_HPreData).colUpper,&ptr_model->colUpper);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->super_HPreData).rowLower,&ptr_model->rowLower);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->super_HPreData).rowUpper,&ptr_model->rowUpper);
  this->AcountX =
       (int)((ulong)((long)(this->oAvalue).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->oAvalue).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3);
  return;
}

Assistant:

void HinOut::readDataPostsolve(HModel & ptr_model) {
	numCol = ptr_model.numCol;
    numRow = ptr_model.numRow;
    numTot = ptr_model.numCol + ptr_model.numRow;
    Astart = ptr_model.Astart;
    Aindex = ptr_model.Aindex;
    Avalue = ptr_model.Avalue;
    colCost = ptr_model.colCost;
    colLower = ptr_model.colLower;
    colUpper = ptr_model.colUpper;
    rowLower = ptr_model.rowLower;
    rowUpper = ptr_model.rowUpper;

    AcountX = oAvalue.size();
}